

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O1

int tryReaping(pid_t pid,pipe_payload *payload)

{
  __pid_t _Var1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  int status;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 0xaaaaaaaa;
  _Var1 = wait4(pid,&local_14,1,(rusage *)&payload->rusage);
  if (_Var1 < 1) {
    iVar2 = 0;
  }
  else {
    uVar3 = local_14 & 0x7f;
    if (uVar3 == 0) {
      (payload->info).code = 1;
      uVar3 = local_14 >> 8 & 0xff;
    }
    else {
      iVar2 = 1;
      if ((int)(uVar3 * 0x1000000 + 0x1000000) < 0x2000000) goto LAB_0044978a;
      (payload->info).code = -1 < (char)local_14 ^ 3;
    }
    (payload->info).status = uVar3;
    iVar2 = 1;
  }
LAB_0044978a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int tryReaping(pid_t pid, struct pipe_payload *payload)
{
    /* reap the child */
#if defined(HAVE_WAIT4)
    int status;
    if (wait4(pid, &status, WNOHANG, &payload->rusage) <= 0)
        return 0;
    convertStatusToForkfdInfo(status, &payload->info);
#else
#  if defined(HAVE_WAITID)
    if (waitid_works) {
        /* we have waitid(2), which gets us some payload values on some systems */
        siginfo_t info;
        info.si_pid = 0;
        int ret = waitid(P_PID, pid, &info, WEXITED | WNOHANG) == 0 && info.si_pid == pid;
        if (!ret)
            return ret;

        payload->info.code = info.si_code;
        payload->info.status = info.si_status;
#    ifdef __linux__
        payload->rusage.ru_utime.tv_sec = info.si_utime / CLOCKS_PER_SEC;
        payload->rusage.ru_utime.tv_usec = info.si_utime % CLOCKS_PER_SEC;
        payload->rusage.ru_stime.tv_sec = info.si_stime / CLOCKS_PER_SEC;
        payload->rusage.ru_stime.tv_usec = info.si_stime % CLOCKS_PER_SEC;
#    endif
        return 1;
    }
#  endif // HAVE_WAITID
    int status;
    if (waitpid(pid, &status, WNOHANG) <= 0)
        return 0;     // child did not change state
    convertStatusToForkfdInfo(status, &payload->info);
#endif // !HAVE_WAIT4

    return 1;
}